

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::draw_action(Application *this)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  float fVar5;
  string local_8a0;
  stringstream local_880 [8];
  stringstream lbs_string;
  ostream local_870 [376];
  string local_6f8;
  stringstream local_6d8 [8];
  stringstream damping_string;
  ostream local_6c8 [376];
  string local_550;
  stringstream local_530 [8];
  stringstream timestep_string;
  ostream local_520 [376];
  string local_3a8;
  undefined1 local_388 [8];
  Color integrator_color;
  stringstream integrator_string;
  ostream local_368 [376];
  string local_1f0;
  undefined1 local_1cc [8];
  Color action_color;
  stringstream local_1b0 [8];
  stringstream actionString;
  ostream local_1a0 [376];
  float local_28;
  int local_24;
  float y;
  int inc;
  float y0;
  float x0;
  size_t size;
  Application *this_local;
  
  if (((*(int *)&(this->super_Renderer).field_0xc == 0) ||
      (*(int *)&(this->super_Renderer).field_0xc == 2)) &&
     ((size = (size_t)this, *(int *)&(this->super_Renderer).field_0xc != 2 ||
      (bVar1 = Timeline::isCurrentlyPlaying(&this->timeline), !bVar1)))) {
    OSDText::clear(&this->textManager);
    std::vector<int,_std::allocator<int>_>::clear(&this->messages);
    _y0 = 0x10;
    local_24 = 0x18;
    iVar3 = 0x18;
    if (((this->super_Renderer).use_hdpi & 1U) != 0) {
      iVar3 = 0x30;
    }
    inc = (int)(float)iVar3;
    iVar3 = 0x28;
    if (((this->super_Renderer).use_hdpi & 1U) != 0) {
      iVar3 = 0x50;
    }
    y = (float)iVar3;
    if (((this->super_Renderer).use_hdpi & 1U) != 0) {
      local_24 = 0x30;
    }
    local_28 = y + (float)local_24 + -16.0;
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"ACTION: ");
    switch(this->action) {
    case Navigate:
      std::operator<<(local_1a0,"Navigate");
      break;
    case Edit:
      std::operator<<(local_1a0,"Edit");
      break;
    case Bevel:
      std::operator<<(local_1a0,"Bevel");
      break;
    case CreateJoint:
      std::operator<<(local_1a0,"Create Joint");
      break;
    case BoneRadius:
      std::operator<<(local_1a0,"Change Threshold Radius");
      break;
    case IK:
      std::operator<<(local_1a0,"Inverse Kinematics");
      break;
    case Wave:
      std::operator<<(local_1a0,"Wave");
      break;
    case Object:
      std::operator<<(local_1a0,"Object Transformation");
      break;
    case Pose:
      std::operator<<(local_1a0,"Pose");
      break;
    default:
      std::operator<<(local_1a0,"(none)");
    }
    Color::Color((Color *)local_1cc,0.3,0.7,0.3,1.0);
    iVar3 = inc;
    fVar5 = local_28;
    std::__cxx11::stringstream::str();
    draw_string(this,(float)iVar3,fVar5,&local_1f0,0x10,(Color *)local_1cc);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (*(int *)&(this->super_Renderer).field_0xc == 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&integrator_color.b);
      std::operator<<(local_368,"Integrator: ");
      if (this->integrator == Forward_Euler) {
        std::operator<<(local_368,"Forward Euler");
      }
      else if (this->integrator == Symplectic_Euler) {
        std::operator<<(local_368,"Symplectic Euler");
      }
      Color::Color((Color *)local_388,0.7,0.3,0.7,1.0);
      iVar3 = inc;
      fVar5 = local_28 + 20.0;
      std::__cxx11::stringstream::str();
      draw_string(this,(float)iVar3,fVar5,&local_3a8,0x10,(Color *)local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::stringstream::stringstream(local_530);
      poVar2 = std::operator<<(local_520,"Timestep: ");
      std::ostream::operator<<(poVar2,this->timestep);
      iVar3 = inc;
      fVar5 = local_28 + 40.0;
      std::__cxx11::stringstream::str();
      draw_string(this,(float)iVar3,fVar5,&local_550,0x10,(Color *)local_388);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::stringstream::stringstream(local_6d8);
      poVar2 = std::operator<<(local_6c8,"Damping Factor: ");
      std::ostream::operator<<(poVar2,this->damping_factor);
      iVar3 = inc;
      fVar5 = local_28 + 60.0;
      std::__cxx11::stringstream::str();
      draw_string(this,(float)iVar3,fVar5,&local_6f8,0x10,(Color *)local_388);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::stringstream::stringstream(local_880);
      poVar2 = std::operator<<(local_870,"Linear Blend Skinning: ");
      pcVar4 = "Naive";
      if ((this->useCapsuleRadius & 1U) != 0) {
        pcVar4 = "Threshold";
      }
      std::operator<<(poVar2,pcVar4);
      iVar3 = inc;
      fVar5 = local_28 + 80.0;
      std::__cxx11::stringstream::str();
      draw_string(this,(float)iVar3,fVar5,&local_8a0,0x10,(Color *)local_388);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::stringstream::~stringstream(local_880);
      std::__cxx11::stringstream::~stringstream(local_6d8);
      std::__cxx11::stringstream::~stringstream(local_530);
      std::__cxx11::stringstream::~stringstream((stringstream *)&integrator_color.b);
    }
    OSDText::render(&this->textManager);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void Application::draw_action()
{
   if( mode != MODEL_MODE && mode != ANIMATE_MODE ) return;
   if (mode == ANIMATE_MODE && timeline.isCurrentlyPlaying()) return;

  textManager.clear();
  messages.clear();

  const size_t size = 16;
  const float x0 = use_hdpi ? 48 : 24;
  const float y0 = use_hdpi ? 80 : 40;
  const int inc  = use_hdpi ? 48  : 24;
  float y = y0 + inc - size;

  stringstream actionString;
  actionString << "ACTION: ";
  switch( action )
  {
     case( Action::Navigate ):
        actionString << "Navigate";
        break;
     case( Action::Edit ):
        actionString << "Edit";
        break;
     case( Action::Bevel ):
        actionString << "Bevel";
        break;
     case ( Action::CreateJoint):
        actionString << "Create Joint";
        break;
     case ( Action::Wave ):
        actionString << "Wave";
        break;
     case ( Action::Object ):
        actionString << "Object Transformation";
        break;
     case ( Action::Pose ):
        actionString << "Pose";
        break;
     case ( Action::IK ):
        actionString << "Inverse Kinematics";
        break;
     case ( Action::BoneRadius ):
        actionString << "Change Threshold Radius";
        break;
     default:
        actionString << "(none)";
        break;
  };



  Color action_color(0.3, .7, 0.3);
  draw_string( x0, y, actionString.str(), size, action_color );

  if (mode == ANIMATE_MODE) {
    stringstream integrator_string;
    integrator_string << "Integrator: ";
    switch (integrator) {
      case Integrator::Forward_Euler:
        integrator_string << "Forward Euler";
        break;
      case Integrator::Symplectic_Euler:
        integrator_string << "Symplectic Euler";
        break;
    }
    Color integrator_color(0.7, 0.3, 0.7);
    draw_string(x0, y + 20, integrator_string.str(), size, integrator_color);
    stringstream timestep_string;
    timestep_string << "Timestep: " << timestep;
    draw_string(x0, y + 40, timestep_string.str(), size, integrator_color);
    stringstream damping_string;
    damping_string << "Damping Factor: " << damping_factor;
    draw_string(x0, y + 60, damping_string.str(), size, integrator_color);
    stringstream lbs_string;
    lbs_string << "Linear Blend Skinning: " << (useCapsuleRadius? "Threshold" : "Naive");
    draw_string(x0, y + 80, lbs_string.str(), size, integrator_color);
  }

  // // No selection --> no messages.
  // if (!scene->has_selection()) {
  //   draw_string(x0, y, "No mesh feature is selected", size, text_color);
  //   y += inc;
  // } else {
  //   DynamicScene::SelectionInfo selectionInfo = scene->get_selection_info();
  //   for (const string& s : selectionInfo) {
  //     size_t split = s.find_first_of(":");
  //     if (split != string::npos) {
  //       split++;
  //       string s1 = s.substr(0,split);
  //       string s2 = s.substr(split);
  //       draw_string(x0, y, s1, size, text_color);
  //       draw_string(x0 + (use_hdpi ? 150 : 75 ), y, s2, size, text_color);
  //     } else {
  //       draw_string(x0, y, s, size, text_color);
  //     }
  //     y += inc;
  //   }
  // }

  // // -- First draw a lovely black rectangle.

  // glPushAttrib(GL_VIEWPORT_BIT);
  // glViewport(0, 0, screenW, screenH);

  // glMatrixMode(GL_PROJECTION);
  // glPushMatrix();
  // glLoadIdentity();
  // glOrtho(0, screenW, screenH, 0, 0, 1);

  // glMatrixMode(GL_MODELVIEW);
  // glPushMatrix();
  // glLoadIdentity();
  // glTranslatef(0, 0, -1);

  // // -- Black with opacity .8;

  // glColor4f(0.0, 0.0, 0.0, 0.8);

  // float min_x = x0 - 32;
  // float min_y = y0 - 32;
  // float max_x = screenW;
  // float max_y = y;

  // float z = 0.0;

  // glDisable(GL_DEPTH_TEST);
  // glDisable(GL_LIGHTING);

  // glBegin(GL_QUADS);

  // glVertex3f(min_x, min_y, z);
  // glVertex3f(min_x, max_y, z);
  // glVertex3f(max_x, max_y, z);
  // glVertex3f(max_x, min_y, z);
  // glEnd();

  // glMatrixMode(GL_PROJECTION);
  // glPopMatrix();

  // glMatrixMode(GL_MODELVIEW);
  // glPopMatrix();

  // glPopAttrib();

  // glEnable(GL_LIGHTING);
  // glEnable(GL_DEPTH_TEST);

  textManager.render();
}